

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

void sparse_list_clear(pax *pax)

{
  undefined8 *__ptr;
  long in_RDI;
  sparse_block_conflict *sb;
  
  while (*(long *)(in_RDI + 0x60) != 0) {
    __ptr = *(undefined8 **)(in_RDI + 0x60);
    *(undefined8 *)(in_RDI + 0x60) = *__ptr;
    free(__ptr);
  }
  *(undefined8 *)(in_RDI + 0x68) = 0;
  return;
}

Assistant:

static void
sparse_list_clear(struct pax *pax)
{
	while (pax->sparse_list != NULL) {
		struct sparse_block *sb = pax->sparse_list;
		pax->sparse_list = sb->next;
		free(sb);
	}
	pax->sparse_tail = NULL;
}